

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O0

bool __thiscall
double_conversion::DoubleToStringConverter::HandleSpecialValues
          (DoubleToStringConverter *this,double value,StringBuilder *result_builder)

{
  bool bVar1;
  StringBuilder *in_RSI;
  StringBuilder *in_RDI;
  double in_XMM0_Qa;
  Double double_inspect;
  undefined7 in_stack_ffffffffffffffc8;
  char in_stack_ffffffffffffffcf;
  char *in_stack_ffffffffffffffd8;
  bool local_1;
  
  Double::Double((Double *)in_RDI,
                 (double)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  bVar1 = Double::IsInfinite((Double *)in_RDI);
  if (bVar1) {
    if (*(long *)&(in_RDI->buffer_).length_ == 0) {
      local_1 = false;
    }
    else {
      if (in_XMM0_Qa < 0.0) {
        StringBuilder::AddCharacter(in_RDI,in_stack_ffffffffffffffcf);
      }
      StringBuilder::AddString(in_RSI,in_stack_ffffffffffffffd8);
      local_1 = true;
    }
  }
  else {
    bVar1 = Double::IsNan((Double *)in_RDI);
    if (bVar1) {
      if (*(long *)&in_RDI->position_ == 0) {
        local_1 = false;
      }
      else {
        StringBuilder::AddString(in_RSI,in_stack_ffffffffffffffd8);
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool DoubleToStringConverter::HandleSpecialValues(
    double value,
    StringBuilder* result_builder) const {
  Double double_inspect(value);
  if (double_inspect.IsInfinite()) {
    if (infinity_symbol_ == NULL) return false;
    if (value < 0) {
      result_builder->AddCharacter('-');
    }
    result_builder->AddString(infinity_symbol_);
    return true;
  }
  if (double_inspect.IsNan()) {
    if (nan_symbol_ == NULL) return false;
    result_builder->AddString(nan_symbol_);
    return true;
  }
  return false;
}